

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

void pbrt::detail::
     Dispatch<pbrt::Light::PDF_Le(pbrt::Ray_const&,float*,float*)const::__0&,void,pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight,void>
               (anon_class_24_3_9d66166c *func,void *ptr,int index)

{
  anon_class_24_3_9d66166c *func_00;
  uint in_EDX;
  ProjectionLight *in_stack_ffffffffffffffd8;
  
  func_00 = (anon_class_24_3_9d66166c *)(ulong)in_EDX;
  switch(func_00) {
  case (anon_class_24_3_9d66166c *)0x0:
    const::$_0::operator()(func_00,(PointLight *)in_stack_ffffffffffffffd8);
    break;
  case (anon_class_24_3_9d66166c *)0x1:
    const::$_0::operator()(func_00,(DistantLight *)in_stack_ffffffffffffffd8);
    break;
  case (anon_class_24_3_9d66166c *)0x2:
    const::$_0::operator()(func_00,in_stack_ffffffffffffffd8);
    break;
  case (anon_class_24_3_9d66166c *)0x3:
    const::$_0::operator()(func_00,(GoniometricLight *)in_stack_ffffffffffffffd8);
    break;
  case (anon_class_24_3_9d66166c *)0x4:
    const::$_0::operator()(func_00,(SpotLight *)in_stack_ffffffffffffffd8);
    break;
  case (anon_class_24_3_9d66166c *)0x5:
    const::$_0::operator()(func_00,(DiffuseAreaLight *)in_stack_ffffffffffffffd8);
    break;
  case (anon_class_24_3_9d66166c *)0x6:
    const::$_0::operator()(func_00,(UniformInfiniteLight *)in_stack_ffffffffffffffd8);
    break;
  case (anon_class_24_3_9d66166c *)0x7:
    const::$_0::operator()(func_00,(ImageInfiniteLight *)in_stack_ffffffffffffffd8);
    break;
  default:
    Dispatch<pbrt::Light::PDF_Le(pbrt::Ray_const&,float*,float*)const::__0&,void,pbrt::PortalImageInfiniteLight>
              (func_00,in_stack_ffffffffffffffd8,0);
  }
  return;
}

Assistant:

PBRT_CPU_GPU R Dispatch(F &&func, const void *ptr, int index) {
    DCHECK_GE(index, 0);

    switch (index) {
    case 0:
        return func((const T0 *)ptr);
    case 1:
        return func((const T1 *)ptr);
    case 2:
        return func((const T2 *)ptr);
    case 3:
        return func((const T3 *)ptr);
    case 4:
        return func((const T4 *)ptr);
    case 5:
        return func((const T5 *)ptr);
    case 6:
        return func((const T6 *)ptr);
    case 7:
        return func((const T7 *)ptr);
    default:
        return Dispatch<F, R, Ts...>(func, ptr, index - 8);
    }
}